

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

bool __thiscall GGSock::Communicator::Data::doConnect(Data *this)

{
  TSocketDescriptor *sock;
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  int enable;
  timespec local_40;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  if (this->isConnecting == true) {
    sock = &this->sd;
    do {
      iVar1 = ::connect(*sock,(sockaddr *)&this->addr,0x10);
      if (-1 < iVar1) {
LAB_0010b2c0:
        this->sdpeer = this->sd;
        printf("Connected successfully, sd = %d\n");
        this->isConnected = true;
        this->isConnecting = false;
        return true;
      }
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if ((1 < iVar1 - 0x72U) && (iVar1 != 0xb)) {
        if (iVar1 == 0x6a) goto LAB_0010b2c0;
        anon_unknown.dwarf_783c::closeAndReset(sock);
        iVar1 = socket(2,1,6);
        *sock = iVar1;
        local_40.tv_sec = CONCAT44(local_40.tv_sec._4_4_,1);
        iVar1 = setsockopt(iVar1,1,2,&local_40,4);
        if (iVar1 < 0) {
          doConnect();
        }
        iVar1 = setsockopt(*sock,1,0xf,&local_40,4);
        if (iVar1 < 0) {
          doConnect();
        }
        anon_unknown.dwarf_783c::setNonBlocking(sock);
      }
      if (this->timeoutConnect_ms < 1) {
        return false;
      }
      local_40.tv_sec = 0;
      local_40.tv_nsec = 1000000;
      do {
        iVar1 = nanosleep(&local_40,&local_40);
        if (iVar1 != -1) break;
      } while (*piVar3 == 4);
      lVar4 = std::chrono::_V2::system_clock::now();
      if ((long)this->timeoutConnect_ms <= (lVar4 - lVar2) / 1000000) {
        anon_unknown.dwarf_783c::closeAndReset(sock);
        this->isConnecting = false;
        return false;
      }
    } while ((this->isConnecting & 1U) != 0);
  }
  return false;
}

Assistant:

bool doConnect() {
            auto tStart = std::chrono::high_resolution_clock::now();

            while (isConnecting) {
                auto rc = ::connect(sd, (struct sockaddr *) &addr, sizeof(addr));
                if (rc < 0 && e_isConnected() == false) {
                    if (e_inProgress() == false && e_wouldBlock() == false) {
                        ::closeAndReset(sd);
                        sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

                        int enable = 1;
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
                        }

#ifndef _WIN32
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
                        }
#endif

                        //{
                        //    linger lin;
                        //    lin.l_onoff = 0;
                        //    lin.l_linger = 0;
                        //    if (setsockopt(sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
                        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
                        //    }
                        //}

                        ::setNonBlocking(sd);
                    }
                    if (timeoutConnect_ms > 0) {
                        std::this_thread::sleep_for(std::chrono::milliseconds(1));

                        auto tEnd = std::chrono::high_resolution_clock::now();
                        if (std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count() >= timeoutConnect_ms) {
                            ::closeAndReset(sd);
                            isConnecting = false;
                        }
                        continue;
                    }

                    return false;
                }

                sdpeer = sd;

                printf("Connected successfully, sd = %d\n", sd);

                isConnecting = false;
                isConnected = true;

                return true;
            }

            return false;
        }